

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

saint_t sufcheck(sauchar_t *T,saidx_t *SA,saidx_t n,saint_t verbose)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char *__ptr;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  saint_t sVar12;
  size_t sStack_430;
  saidx_t C [256];
  
  if (verbose != 0) {
    fwrite("sufcheck: ",10,1,_stderr);
  }
  if ((SA == (saidx_t *)0x0 || T == (sauchar_t *)0x0) || n < 0) {
    sVar12 = -1;
    if (verbose == 0) {
      return -1;
    }
    __ptr = "Invalid arguments.\n";
    sStack_430 = 0x13;
  }
  else {
    if (n == 0) {
      if (verbose == 0) {
        return 0;
      }
    }
    else {
      uVar4 = (ulong)(uint)n;
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        if ((uint)n <= (uint)SA[uVar5]) {
          if (verbose == 0) {
            return -2;
          }
          fprintf(_stderr,"Out of the range [0,%d].\n  SA[%d]=%d\n",(ulong)(n - 1));
          return -2;
        }
      }
      for (lVar7 = 0; uVar4 - 1 != lVar7; lVar7 = lVar7 + 1) {
        if (T[SA[lVar7 + 1]] < T[SA[lVar7]]) {
          if (verbose == 0) {
            return -3;
          }
          fprintf(_stderr,"Suffixes in wrong order.\n  T[SA[%d]=%d]=%d > T[SA[%d]=%d]=%d\n");
          return -3;
        }
      }
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        C[lVar7] = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        C[T[uVar5]] = C[T[uVar5]] + 1;
      }
      iVar6 = 0;
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        iVar11 = C[lVar7];
        C[lVar7] = iVar6;
        iVar6 = iVar11 + iVar6;
      }
      bVar1 = T[n - 1U];
      uVar2 = C[bVar1];
      C[bVar1] = uVar2 + 1;
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        uVar9 = (ulong)bVar1;
        uVar10 = n - 1U;
        uVar3 = uVar2;
        if (0 < SA[uVar5]) {
          uVar10 = SA[uVar5] - 1;
          uVar9 = (ulong)T[uVar10];
          uVar3 = C[uVar9];
        }
        uVar8 = (ulong)uVar3;
        if (((int)uVar3 < 0) || (uVar10 != SA[uVar8])) {
          if (verbose == 0) {
            return -4;
          }
          if ((int)uVar3 < 0) {
            uVar4 = 0xffffffffffffffff;
          }
          else {
            uVar4 = (ulong)(uint)SA[uVar8];
          }
          fprintf(_stderr,"Suffix in wrong position.\n  SA[%d]=%d or\n  SA[%d]=%d\n",uVar8,uVar4);
          return -4;
        }
        if (uVar3 != uVar2) {
          iVar6 = C[uVar9];
          iVar11 = iVar6 + 1;
          C[uVar9] = iVar11;
          if ((n <= iVar11) || (T[SA[(long)iVar6 + 1]] != (sauchar_t)uVar9)) {
            C[uVar9] = -1;
          }
        }
      }
      if (verbose < 1) {
        return 0;
      }
    }
    sVar12 = 0;
    __ptr = "Done.\n";
    sStack_430 = 6;
  }
  fwrite(__ptr,sStack_430,1,_stderr);
  return sVar12;
}

Assistant:

saint_t
sufcheck(const sauchar_t *T, const saidx_t *SA,
         saidx_t n, saint_t verbose) {
  saidx_t C[ALPHABET_SIZE];
  saidx_t i, p, q, t;
  saint_t c;

  if(verbose) { fprintf(stderr, "sufcheck: "); }

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) {
    if(verbose) { fprintf(stderr, "Invalid arguments.\n"); }
    return -1;
  }
  if(n == 0) {
    if(verbose) { fprintf(stderr, "Done.\n"); }
    return 0;
  }

  /* check range: [0..n-1] */
  for(i = 0; i < n; ++i) {
    if((SA[i] < 0) || (n <= SA[i])) {
      if(verbose) {
        fprintf(stderr, "Out of the range [0,%" PRIdSAIDX_T "].\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        n - 1, i, SA[i]);
      }
      return -2;
    }
  }

  /* check first characters. */
  for(i = 1; i < n; ++i) {
    if(T[SA[i - 1]] > T[SA[i]]) {
      if(verbose) {
        fprintf(stderr, "Suffixes in wrong order.\n"
                        "  T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d"
                        " > T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d\n",
                        i - 1, SA[i - 1], T[SA[i - 1]], i, SA[i], T[SA[i]]);
      }
      return -3;
    }
  }

  /* check suffixes. */
  for(i = 0; i < ALPHABET_SIZE; ++i) { C[i] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(i = 0, p = 0; i < ALPHABET_SIZE; ++i) {
    t = C[i];
    C[i] = p;
    p += t;
  }

  q = C[T[n - 1]];
  C[T[n - 1]] += 1;
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if(0 < p) {
      c = T[--p];
      t = C[c];
    } else {
      c = T[p = n - 1];
      t = q;
    }
    if((t < 0) || (p != SA[t])) {
      if(verbose) {
        fprintf(stderr, "Suffix in wrong position.\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T " or\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        t, (0 <= t) ? SA[t] : -1, i, SA[i]);
      }
      return -4;
    }
    if(t != q) {
      ++C[c];
      if((n <= C[c]) || (T[SA[C[c]]] != c)) { C[c] = -1; }
    }
  }

  if(1 <= verbose) { fprintf(stderr, "Done.\n"); }
  return 0;
}